

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::EnforceCommentStyle::fixComment
          (EnforceCommentStyle *this,string *s,bool preserve_hash)

{
  char *pcVar1;
  byte in_DL;
  string *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [48];
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if ((*(char *)(in_RDI + 0x11) == 'h') &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar1 == '/')) {
    in_stack_ffffffffffffff48 = local_58;
    std::__cxx11::string::substr((ulong)in_stack_ffffffffffffff48,(ulong)local_10);
    std::operator+((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::operator=(local_10,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
  }
  if (((*(char *)(in_RDI + 0x11) == 's') &&
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_10), *pcVar1 == '#')) &&
     (((local_11 & 1) == 0 ||
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_10), *pcVar1 != '!')))) {
    __rhs = &local_a8;
    std::__cxx11::string::substr((ulong)__rhs,(ulong)local_10);
    std::operator+((char *)in_stack_ffffffffffffff48,__rhs);
    std::__cxx11::string::operator=(local_10,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void fixComment(std::string &s, bool preserve_hash)
    {
        if (opts.commentStyle == 'h' && s[0] == '/') {
            s = "#" + s.substr(2);
        }
        if (opts.commentStyle == 's' && s[0] == '#') {
            if (preserve_hash && s[1] == '!')
                return;
            s = "//" + s.substr(1);
        }
    }